

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NodeImpl.hh
# Opt level: O2

void __thiscall
avro::
NodeImpl<avro::concepts::NoAttribute<avro::Name>,_avro::concepts::SingleAttribute<boost::shared_ptr<avro::Node>_>,_avro::concepts::NoAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_avro::concepts::NoAttribute<int>_>
::doAddName(NodeImpl<avro::concepts::NoAttribute<avro::Name>,_avro::concepts::SingleAttribute<boost::shared_ptr<avro::Node>_>,_avro::concepts::NoAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_avro::concepts::NoAttribute<int>_>
            *this,string *name)

{
  bool bVar1;
  Exception *this_00;
  basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *msg;
  basic_format<char,_std::char_traits<char>,_std::allocator<char>_> bStack_f8;
  
  bVar1 = concepts::
          NameIndexConcept<avro::concepts::NoAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::add((NameIndexConcept<avro::concepts::NoAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&this->field_0x22,name,0);
  if (bVar1) {
    concepts::
    NoAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    add((NoAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&this->field_0x20,name);
    return;
  }
  this_00 = (Exception *)__cxa_allocate_exception(0x18);
  boost::basic_format<char,_std::char_traits<char>,_std::allocator<char>_>::basic_format
            (&bStack_f8,"Cannot add duplicate name: %1%");
  msg = boost::io::detail::
        feed<char,std::char_traits<char>,std::allocator<char>,std::__cxx11::string_const&>
                  (&bStack_f8,name);
  Exception::Exception(this_00,msg);
  __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

void doAddName(const std::string &name) { 
        if (! nameIndex_.add(name, leafNameAttributes_.size())) {
            throw Exception(boost::format("Cannot add duplicate name: %1%") % name);
        }
        leafNameAttributes_.add(name);
    }